

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O1

double __thiscall
TOICompactRewardDecPOMDPDiscrete::GetReward
          (TOICompactRewardDecPOMDPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indSIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indAIs)

{
  RewardModel *pRVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_long __tmp;
  undefined1 auVar7 [16];
  double extraout_XMM0_Qa;
  double dVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexVec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrElems;
  double local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  lVar3 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                 super_TransitionObservationIndependentMADPDiscrete.
                                 super_MultiAgentDecisionProcess + 0x10))();
  dVar8 = 0.0;
  if (lVar3 == 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = 0.0;
    uVar5 = 1;
    uVar6 = 0;
    do {
      pRVar1 = (this->_m_p_rModels).
               super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      (**(pRVar1->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface)
                (pRVar1,(ulong)(indSIs->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar6],
                 (ulong)(indAIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar6]);
      local_70 = local_70 + dVar8;
      uVar6 = (ulong)uVar5;
      uVar4 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      uVar5 = uVar5 + 1;
      dVar8 = extraout_XMM0_Qa;
    } while (uVar4 != uVar6);
  }
  lVar3 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                 super_TransitionObservationIndependentMADPDiscrete.
                                 super_MultiAgentDecisionProcess + 0x10))(this);
  if (lVar3 == 2) {
    dVar8 = RewardModelTOISparse::Get((this->super_TOIDecPOMDPDiscrete)._m_p_rModel,indSIs,indAIs);
    local_70 = local_70 + dVar8;
  }
  else {
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 2;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[0] = 0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                           super_TransitionObservationIndependentMADPDiscrete.
                           super_MultiAgentDecisionProcess + 0x10))(this);
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + 0x10);
    auVar7 = vpbroadcastq_avx512vl();
    *(undefined1 (*) [16])
     local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = auVar7;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    do {
      if (*local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[1]) {
        dVar8 = GetTwoAgentReward(this,*local_68.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                  local_68.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[1],indSIs,indAIs);
        local_70 = local_70 + dVar8;
      }
      bVar2 = IndexTools::Increment(&local_68,&local_48);
    } while (!bVar2);
    if ((undefined1 (*) [16])
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (undefined1 (*) [16])0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (Index *)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return local_70;
}

Assistant:

double TOICompactRewardDecPOMDPDiscrete::GetReward(
    const std::vector<Index> &indSIs,
    const std::vector<Index> &indAIs) const
{
    double reward=0;

    for(unsigned int i=0;i!=GetNrAgents();++i)
        reward+=GetIndividualReward(indSIs[i],indAIs[i],i);

    switch(GetNrAgents())
    {
    case 2:
        reward+=_m_p_rModel->Get(indSIs,indAIs);
        break;
    default:
    {
        vector<Index> indexVec(2,0);
        vector<size_t> nrElems(2,GetNrAgents());

        do
        {
#if 0
            if(indexVec[0]!=indexVec[1] &&
               GetTwoAgentReward(indexVec[0],indexVec[1],indSIs,indAIs)!=0)
                cout << "adding  i " << indexVec[0]
                     << " si " << indSIs[indexVec[0]] 
                     << GetIndividualMADPD(indexVec[0])->GetState(indSIs[indexVec[0]])->SoftPrint()
                     << " j " << indexVec[1] 
                     << " sj " << indSIs[indexVec[1]]
                     << GetIndividualMADPD(indexVec[1])->GetState(indSIs[indexVec[1]])->SoftPrint()
                     << " r "
                     << GetTwoAgentReward(indexVec[0],indexVec[1],
                                          indSIs,indAIs) << endl;
#endif
            if(indexVec[0]!=indexVec[1])
                reward+=GetTwoAgentReward(indexVec[0],indexVec[1],
                                          indSIs,indAIs);
        }
        while(!IndexTools::Increment(indexVec,nrElems));

#if 0
        reward2+=GetTwoAgentReward(0,1,indSIs,indAIs);
        reward2+=GetTwoAgentReward(1,0,indSIs,indAIs);

        reward2+=GetTwoAgentReward(0,2,indSIs,indAIs);
        reward2+=GetTwoAgentReward(2,0,indSIs,indAIs);

        reward2+=GetTwoAgentReward(1,2,indSIs,indAIs);
        reward2+=GetTwoAgentReward(2,1,indSIs,indAIs);
#endif
        break;
    }
    }

#if DEBUG_TOICompactRewardDecPOMDPDiscrete
    cout << "GetReward(" << sI << "," << jaI << ") = " << reward << endl;
#endif
    return(reward);
}